

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O3

edata_t * emap_try_acquire_edata_neighbor_impl
                    (tsdn_t *tsdn,emap_t *emap,edata_t *edata,extent_pai_t pai,
                    extent_state_t expected_state,_Bool forward,_Bool expanding)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  rtree_leaf_elm_t *prVar12;
  edata_t *edata_00;
  long lVar13;
  undefined7 in_register_00000089;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  if ((int)CONCAT71(in_register_00000089,forward) == 0) {
    uVar8 = 0xfffffffffffff000;
  }
  else {
    if (edata->e_addr == (void *)0x0) {
      return (edata_t *)0x0;
    }
    uVar8 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  }
  uVar8 = ((ulong)edata->e_addr & 0xfffffffffffff000) + uVar8;
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = uVar8 & 0xffffffffc0000000;
  uVar11 = (ulong)(((uint)(uVar8 >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar11);
  uVar11 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar11);
  if (uVar11 == uVar10) {
    prVar12 = (rtree_leaf_elm_t *)((ulong)((uint)(uVar8 >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar10) {
    prVar12 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar11;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar10;
    puVar1[1] = (ulong)prVar12;
    prVar12 = (rtree_leaf_elm_t *)
              ((long)&(prVar12->le_bits).repr + (ulong)((uint)uVar8 >> 9 & 0x1ffff8));
  }
  else {
    lVar13 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar13 + -8) == uVar10) {
        uVar5 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar13);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar13 + -0x18);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar13 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(ulong *)((long)ctx->cache + lVar13 + -0x18) = uVar11;
        *(ulong *)((long)(ctx->cache + -1) + lVar13) = puVar1[1];
        *puVar1 = uVar10;
        puVar1[1] = uVar5;
        prVar12 = (rtree_leaf_elm_t *)(((uint)uVar8 >> 9 & 0x1ffff8) + uVar5);
        goto LAB_01c4d060;
      }
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x188);
    prVar12 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,uVar8,false,false);
  }
LAB_01c4d060:
  if (prVar12 != (rtree_leaf_elm_t *)0x0) {
    pvVar4 = (prVar12->le_bits).repr;
    edata_00 = (edata_t *)(((long)pvVar4 << 0x10) >> 0x10 & 0xffffffffffffff80);
    if (edata_00 != (edata_t *)0x0) {
      if (forward) {
        uVar8 = (ulong)pvVar4 & 2;
      }
      else {
        uVar8 = edata->e_bits >> 0x2c & 1;
      }
      if (uVar8 == 0) {
        uVar7 = (uint)edata->e_bits;
        if (pai == EXTENT_PAI_PAC) {
          if (((extent_state_t)((ulong)pvVar4 >> 2) &
              (extent_state_transition|extent_state_retained)) != expected_state) {
            return (edata_t *)0x0;
          }
          uVar9 = (uint)edata_00->e_bits;
          if ((!expanding) && (((uVar9 ^ uVar7) >> 0xd & 1) != 0)) {
            return (edata_t *)0x0;
          }
        }
        else {
          if (((ulong)pvVar4 >> 2 & 7) == 0) {
            return (edata_t *)0x0;
          }
          uVar9 = (uint)edata_00->e_bits;
        }
        if (((uVar9 >> 0xe & EXTENT_PAI_HPA) == pai) &&
           ((duckdb_je_opt_retain != false || (((uVar9 ^ uVar7) & 0xfff) == 0)))) {
          duckdb_je_emap_update_edata_state(tsdn,emap,edata_00,extent_state_max);
          return edata_00;
        }
      }
    }
  }
  return (edata_t *)0x0;
}

Assistant:

static inline edata_t *
emap_try_acquire_edata_neighbor_impl(tsdn_t *tsdn, emap_t *emap, edata_t *edata,
    extent_pai_t pai, extent_state_t expected_state, bool forward,
    bool expanding) {
	witness_assert_positive_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE);
	assert(!edata_guarded_get(edata));
	assert(!expanding || forward);
	assert(!edata_state_in_transition(expected_state));
	assert(expected_state == extent_state_dirty ||
	       expected_state == extent_state_muzzy ||
	       expected_state == extent_state_retained);

	void *neighbor_addr = forward ? edata_past_get(edata) :
	    edata_before_get(edata);
	/*
	 * This is subtle; the rtree code asserts that its input pointer is
	 * non-NULL, and this is a useful thing to check.  But it's possible
	 * that edata corresponds to an address of (void *)PAGE (in practice,
	 * this has only been observed on FreeBSD when address-space
	 * randomization is on, but it could in principle happen anywhere).  In
	 * this case, edata_before_get(edata) is NULL, triggering the assert.
	 */
	if (neighbor_addr == NULL) {
		return NULL;
	}

	EMAP_DECLARE_RTREE_CTX;
	rtree_leaf_elm_t *elm = rtree_leaf_elm_lookup(tsdn, &emap->rtree,
	    rtree_ctx, (uintptr_t)neighbor_addr, /* dependent*/ false,
	    /* init_missing */ false);
	if (elm == NULL) {
		return NULL;
	}

	rtree_contents_t neighbor_contents = rtree_leaf_elm_read(tsdn,
	    &emap->rtree, elm, /* dependent */ false);
	if (!extent_can_acquire_neighbor(edata, neighbor_contents, pai,
	    expected_state, forward, expanding)) {
		return NULL;
	}

	/* From this point, the neighbor edata can be safely acquired. */
	edata_t *neighbor = neighbor_contents.edata;
	assert(edata_state_get(neighbor) == expected_state);
	emap_update_edata_state(tsdn, emap, neighbor, extent_state_merging);
	if (expanding) {
		extent_assert_can_expand(edata, neighbor);
	} else {
		extent_assert_can_coalesce(edata, neighbor);
	}

	return neighbor;
}